

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O3

string * __thiscall
ValidationState<BlockValidationResult>::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState<BlockValidationResult> *this)

{
  pointer pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_mode == M_VALID) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0075b15c;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Valid","");
  }
  else if ((this->m_debug_message)._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->m_reject_reason)._M_dataplus._M_p;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_0075b15c;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->m_reject_reason)._M_string_length);
  }
  else {
    pcVar1 = (this->m_reject_reason)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->m_reject_reason)._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_48,", ");
    pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_48,(this->m_debug_message)._M_dataplus._M_p,
                       (this->m_debug_message)._M_string_length);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar3->_M_dataplus)._M_p;
    paVar4 = &pbVar3->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar4) {
      uVar2 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar4->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
    (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar3->_M_string_length = 0;
    (pbVar3->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_0075b15c:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        if (IsValid()) {
            return "Valid";
        }

        if (!m_debug_message.empty()) {
            return m_reject_reason + ", " + m_debug_message;
        }

        return m_reject_reason;
    }